

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t archive_acl_from_text_l
                  (archive_acl *acl,char *text,wchar_t want_type,archive_string_conv *sc)

{
  byte *pbVar1;
  char cVar2;
  anon_struct_16_2_267fbce2 *paVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  char *p;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  archive_acl_entry *paVar12;
  wchar_t tag;
  anon_struct_16_2_267fbce2 *paVar13;
  uint uVar14;
  byte *pbVar15;
  ulong uVar16;
  byte bVar17;
  char *pcVar18;
  byte *pbVar19;
  int *piVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  wchar_t wVar24;
  byte *pbVar25;
  wchar_t local_e0;
  wchar_t local_dc;
  wchar_t id;
  wchar_t local_d4;
  char *local_d0;
  wchar_t local_c4;
  char *local_c0;
  ulong local_b8;
  wchar_t local_ac;
  archive_acl *local_a8;
  archive_string_conv *local_a0;
  anon_struct_16_2_267fbce2 field [6];
  
  uVar23 = 5;
  local_c4 = want_type;
  if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
    if (want_type == L'㰀') {
      uVar23 = 6;
    }
    else {
      if (want_type != L'̀') {
        return L'\xffffffe2';
      }
      local_c4 = L'Ā';
    }
  }
  local_ac = L'\0';
  wVar8 = L'\0';
  local_a8 = acl;
  local_a0 = sc;
switchD_005f8f3a_caseD_7:
  do {
    do {
      local_dc = wVar8;
      if (((byte *)text == (byte *)0x0) || (*text == 0)) {
        archive_acl_reset(local_a8,local_ac);
        return local_dc;
      }
      pbVar15 = (byte *)text;
      uVar16 = 0;
      uVar22 = 1;
      paVar3 = field + 1;
      do {
        while ((paVar13 = paVar3, uVar9 = uVar22, uVar21 = uVar16, uVar16 = (ulong)*pbVar15,
               uVar16 < 0x21 && ((0x100000600U >> (uVar16 & 0x3f) & 1) != 0))) {
          pbVar15 = pbVar15 + 1;
          uVar16 = uVar21;
          uVar22 = uVar9;
          paVar3 = paVar13;
        }
        uVar22 = 0;
        while ((bVar17 = (byte)uVar16, 0x3a < bVar17 ||
               ((0x400100800000401U >> (uVar16 & 0x3f) & 1) == 0))) {
          lVar10 = uVar22 + 1;
          uVar22 = uVar22 + 1;
          uVar16 = (ulong)pbVar15[lVar10];
        }
        pbVar25 = pbVar15 + uVar22;
        pbVar19 = pbVar15;
        for (pbVar1 = pbVar25; (uVar22 != 0 && (pbVar19 = pbVar1, (ulong)pbVar1[-1] < 0x21));
            pbVar1 = pbVar1 + -1) {
          uVar22 = 0x100000600U >> ((ulong)pbVar1[-1] & 0x3f) & 1;
        }
        if (bVar17 == 0x23) {
          uVar16 = 0x23;
          while ((bVar17 = (byte)uVar16, 0x2c < bVar17 ||
                 ((0x100000000401U >> (uVar16 & 0x3f) & 1) == 0))) {
            pbVar1 = pbVar25 + 1;
            pbVar25 = pbVar25 + 1;
            uVar16 = (ulong)*pbVar1;
          }
        }
        text = (char *)(pbVar25 + (bVar17 != 0));
        if (uVar21 < uVar23) {
          field[uVar21].start = (char *)pbVar15;
          field[uVar21].end = (char *)pbVar19;
        }
        pcVar18 = field[0].start;
        pbVar15 = (byte *)text;
        uVar16 = uVar21 + 1;
        uVar22 = uVar9 + 1;
        paVar3 = paVar13 + 1;
      } while (bVar17 == 0x3a);
      for (; uVar9 < uVar23; uVar9 = uVar9 + 1) {
        paVar13->start = (char *)0x0;
        paVar13->end = (char *)0x0;
        paVar13 = paVar13 + 1;
      }
    } while ((field[0].start != (char *)0x0) && (wVar8 = local_dc, *field[0].start == '#'));
    id = L'\xffffffff';
    local_d4 = L'\0';
    uVar16 = (long)field[0].end - (long)field[0].start;
    if (local_c4 == L'㰀') goto code_r0x005f8f18;
    iVar4 = 0;
    if (*field[0].start == 'd') {
      local_e0 = L'Ȁ';
      if (uVar16 == 1) {
LAB_005f8f6b:
        iVar4 = 1;
      }
      else {
        if (uVar16 < 7) goto LAB_005f8fa3;
        local_d0 = field[0].start;
        iVar4 = bcmp(field[0].start + 1,"efault",6);
        if (iVar4 == 0) {
          iVar4 = 0;
          if (uVar16 == 7) goto LAB_005f8f6b;
          field[0].start = local_d0 + 7;
        }
        else {
          local_e0 = local_c4;
          iVar4 = 0;
        }
      }
    }
    else {
LAB_005f8fa3:
      local_e0 = local_c4;
    }
    uVar16 = (ulong)((iVar4 + 1U) * 0x10);
    local_d0 = *(char **)((long)&field[0].start + uVar16);
    local_c0 = *(char **)((long)&field[0].end + uVar16);
    isint(local_d0,local_c0,&id);
    uVar6 = (uint)uVar21;
    if ((id == L'\xffffffff') && (iVar4 + 3U <= uVar6)) {
      uVar16 = (ulong)((iVar4 + 3U) * 0x10);
      isint(*(char **)((long)&field[0].start + uVar16),*(char **)((long)&field[0].end + uVar16),&id)
      ;
    }
    pcVar18 = *(char **)((long)&field[0].start + (ulong)(uint)(iVar4 << 4));
    pcVar11 = *(char **)((long)&field[0].end + (ulong)(uint)(iVar4 << 4));
    wVar8 = L'\xffffffec';
    lVar10 = (long)pcVar11 - (long)pcVar18;
  } while ((pcVar11 == pcVar18) ||
          (uVar14 = (int)*pcVar18 - 0x67U >> 1 | (uint)(((int)*pcVar18 - 0x67U & 1) != 0) << 0x1f,
          7 < uVar14));
  piVar20 = (int *)(pcVar18 + 1);
  switch(uVar14) {
  case 0:
    wVar24 = L'✔';
    tag = L'✓';
    if ((lVar10 != 1) && ((lVar10 != 5 || (*piVar20 != 0x70756f72)))) goto switchD_005f8f3a_caseD_7;
    break;
  default:
    goto switchD_005f8f3a_caseD_7;
  case 3:
    tag = L'✕';
    if (lVar10 == 1) goto LAB_005f9288;
    if (lVar10 != 4) goto switchD_005f8f3a_caseD_7;
    iVar5 = bcmp(piVar20,"ask",3);
    tag = L'✕';
    wVar8 = L'\xffffffec';
    if (iVar5 != 0) goto switchD_005f8f3a_caseD_7;
    goto LAB_005f9288;
  case 4:
    tag = L'✖';
    if ((lVar10 != 1) && ((lVar10 != 5 || (*piVar20 != 0x72656874)))) goto switchD_005f8f3a_caseD_7;
LAB_005f9288:
    if ((local_d0 < local_c0 && iVar4 + 1U == uVar6) &&
       (wVar8 = ismode(local_d0,local_c0,&local_d4), wVar8 != L'\0')) {
      pcVar18 = (char *)0x0;
      local_d0 = (char *)0x0;
      iVar5 = -1;
      goto LAB_005f930e;
    }
    wVar8 = L'\xffffffec';
    if (iVar4 + 2U == uVar6 && local_d0 < local_c0) goto switchD_005f8f3a_caseD_7;
    pcVar18 = (char *)0x0;
    local_d0 = (char *)0x0;
    iVar5 = 0;
    goto LAB_005f930e;
  case 7:
    wVar24 = L'✒';
    tag = L'✑';
    if (lVar10 != 1) {
      if (lVar10 != 4) goto switchD_005f8f3a_caseD_7;
      iVar5 = bcmp(piVar20,"ser",3);
      tag = L'✑';
      wVar8 = L'\xffffffec';
      if (iVar5 != 0) goto switchD_005f8f3a_caseD_7;
    }
  }
  iVar5 = 0;
  pcVar18 = local_c0;
  if ((local_c0 <= local_d0) && (id == L'\xffffffff')) {
    pcVar18 = (char *)0x0;
    local_d0 = (char *)0x0;
    tag = wVar24;
  }
LAB_005f930e:
  wVar24 = local_d4;
  if (local_d4 == L'\0') {
    uVar6 = iVar5 + iVar4 + 2;
    wVar7 = ismode(field[uVar6].start,field[uVar6].end,&local_d4);
    wVar8 = L'\xffffffec';
    wVar24 = local_d4;
    if (wVar7 != L'\0') goto LAB_005f9616;
    goto switchD_005f8f3a_caseD_7;
  }
LAB_005f9616:
  local_c0 = pcVar18;
  local_b8 = CONCAT44(local_b8._4_4_,id);
  wVar8 = acl_special(local_a8,local_e0,wVar24,tag);
  if (wVar8 != L'\0') {
    paVar12 = acl_new_entry(local_a8,local_e0,wVar24,tag,(wchar_t)local_b8);
    if (paVar12 == (archive_acl_entry *)0x0) {
      return L'\xffffffe7';
    }
    if (((local_d0 == (char *)0x0) || (local_c0 == local_d0)) || (*local_d0 == '\0')) {
      archive_mstring_clean(&paVar12->name);
    }
    else {
      wVar8 = archive_mstring_copy_mbs_len_l
                        (&paVar12->name,local_d0,(long)local_c0 - (long)local_d0,local_a0);
      if (wVar8 != L'\0') {
        piVar20 = __errno_location();
        local_dc = L'\xffffffec';
        if (*piVar20 == 0xc) {
          return L'\xffffffe2';
        }
      }
    }
  }
  local_ac = local_ac | local_e0;
  wVar8 = local_dc;
  goto switchD_005f8f3a_caseD_7;
code_r0x005f8f18:
  wVar8 = L'\xffffffec';
  switch(uVar16) {
  case 4:
    if (*(int *)field[0].start != 0x72657375) goto switchD_005f8f3a_caseD_7;
    tag = L'✑';
    goto LAB_005f9156;
  case 5:
    iVar4 = bcmp(field[0].start,"group",5);
    wVar8 = L'\xffffffec';
    if (iVar4 != 0) goto switchD_005f8f3a_caseD_7;
    tag = L'✓';
LAB_005f9156:
    pcVar18 = field[1].end;
    local_d0 = field[1].start;
    isint(field[1].start,field[1].end,&id);
    iVar4 = 1;
    break;
  case 6:
    iVar4 = bcmp(field[0].start,"owner@",6);
    if (iVar4 != 0) {
      iVar4 = bcmp(pcVar18,"group@",6);
      wVar8 = L'\xffffffec';
      if (iVar4 != 0) goto switchD_005f8f3a_caseD_7;
      tag = L'✔';
      goto LAB_005f9115;
    }
    pcVar18 = (char *)0x0;
    tag = L'✒';
    local_d0 = (char *)0x0;
    iVar4 = 0;
    break;
  default:
    goto switchD_005f8f3a_caseD_7;
  case 9:
    iVar4 = bcmp(field[0].start,"everyone@",9);
    wVar8 = L'\xffffffec';
    if (iVar4 != 0) goto switchD_005f8f3a_caseD_7;
    tag = L'❻';
LAB_005f9115:
    pcVar18 = (char *)0x0;
    local_d0 = (char *)0x0;
    iVar4 = 0;
  }
  local_b8 = (ulong)(uint)(iVar4 << 4);
  pcVar11 = *(char **)((long)&field[1].start + local_b8);
  wVar24 = L'\0';
LAB_005f9373:
  wVar8 = L'\xffffffec';
  if (*(char **)((long)&field[1].end + local_b8) <= pcVar11) goto LAB_005f941c;
  cVar2 = *pcVar11;
  pcVar11 = pcVar11 + 1;
  uVar6 = 8;
  switch(cVar2) {
  case 'o':
    uVar6 = 0x4000;
    break;
  case 'p':
    uVar6 = 0x20;
    break;
  case 'q':
  case 't':
  case 'u':
  case 'v':
    goto switchD_005f93cb_caseD_71;
  case 'r':
    break;
  case 's':
    uVar6 = 0x8000;
    break;
  case 'w':
    uVar6 = 0x10;
    break;
  case 'x':
    uVar6 = 1;
    break;
  default:
    goto switchD_005f93cb_default;
  }
switchD_005f93cb_caseD_72:
  wVar24 = wVar24 | uVar6;
  goto LAB_005f9373;
LAB_005f941c:
  pcVar11 = *(char **)((long)&field[2].start + local_b8);
  while (local_c0 = pcVar18, pcVar11 < *(char **)((long)&field[2].end + local_b8)) {
    cVar2 = *pcVar11;
    pcVar11 = pcVar11 + 1;
    if (cVar2 != '-') {
      if (cVar2 == 'F') {
        uVar6 = 0x40000000;
      }
      else if (cVar2 == 'I') {
        uVar6 = 0x1000000;
      }
      else if (cVar2 == 'S') {
        uVar6 = 0x20000000;
      }
      else if (cVar2 == 'n') {
        uVar6 = 0x8000000;
      }
      else if (cVar2 == 'f') {
        uVar6 = 0x2000000;
      }
      else if (cVar2 == 'i') {
        uVar6 = 0x10000000;
      }
      else {
        if (cVar2 != 'd') goto switchD_005f93cb_caseD_71;
        uVar6 = 0x4000000;
      }
      wVar24 = wVar24 | uVar6;
    }
  }
  piVar20 = *(int **)((long)&field[3].start + local_b8);
  lVar10 = *(long *)((long)&field[3].end + local_b8) - (long)piVar20;
  local_d4 = wVar24;
  if (lVar10 == 5) {
    iVar4 = bcmp(piVar20,"allow",5);
    if (iVar4 == 0) {
      local_e0 = L'Ѐ';
    }
    else {
      iVar4 = bcmp(piVar20,"audit",5);
      if (iVar4 == 0) {
        local_e0 = L'က';
      }
      else {
        iVar4 = bcmp(piVar20,"alarm",5);
        wVar8 = L'\xffffffec';
        if (iVar4 != 0) goto switchD_005f8f3a_caseD_7;
        local_e0 = L'\x2000';
      }
    }
  }
  else {
    if ((lVar10 != 4) || (*piVar20 != 0x796e6564)) goto switchD_005f8f3a_caseD_7;
    local_e0 = L'ࠀ';
  }
  isint(*(char **)((long)&field[4].start + local_b8),*(char **)((long)&field[4].end + local_b8),&id)
  ;
  pcVar18 = local_c0;
  goto LAB_005f9616;
switchD_005f93cb_default:
  if (cVar2 == '-') goto LAB_005f9373;
  if (cVar2 == 'A') {
    uVar6 = 0x400;
  }
  else if (cVar2 == 'C') {
    uVar6 = 0x2000;
  }
  else if (cVar2 == 'D') {
    uVar6 = 0x100;
  }
  else if (cVar2 == 'R') {
    uVar6 = 0x40;
  }
  else if (cVar2 == 'W') {
    uVar6 = 0x80;
  }
  else if (cVar2 == 'a') {
    uVar6 = 0x200;
  }
  else if (cVar2 == 'c') {
    uVar6 = 0x1000;
  }
  else {
    if (cVar2 != 'd') goto switchD_005f93cb_caseD_71;
    uVar6 = 0x800;
  }
  goto switchD_005f93cb_caseD_72;
switchD_005f93cb_caseD_71:
  local_d4 = wVar24;
  goto switchD_005f8f3a_caseD_7;
}

Assistant:

int
archive_acl_from_text_l(struct archive_acl *acl, const char *text,
    int want_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[6], name;

	const char *s, *st;
	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	char sep;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	ret = ARCHIVE_OK;
	types = 0;

	while (text != NULL &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == '#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			#ifdef __clang_analyzer__
			assert(s);
			#endif
			len = field[0].end - field[0].start;
			if (*s == 'd' && (len == 1 || (len >= 7
			    && memcmp((s + 1), "efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > (n + 3))
				isint(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			if (len == 0) {
				ret = ARCHIVE_WARN;
				continue;
			}

			switch (*s) {
			case 'u':
				if (len == 1 || (len == 4
				    && memcmp(st, "ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case 'g':
				if (len == 1 || (len == 5
				    && memcmp(st, "roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 'o':
				if (len == 1 || (len == 5
				    && memcmp(st, "ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case 'm':
				if (len == 1 || (len == 4
				    && memcmp(st, "ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 3
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (memcmp(s, "user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (memcmp(s, "group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (memcmp(s, "owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (memcmp(s, "group@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (memcmp(s, "everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
				break;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (memcmp(s, "deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (memcmp(s, "allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (memcmp(s, "audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (memcmp(s, "alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint(field[4 + n].start, field[4 + n].end,
			    &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}